

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned__int128>
                   (appender out,write_int_arg<unsigned___int128> arg,
                   basic_format_specs<char> *specs,locale_ref loc)

{
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 n_01 [16];
  undefined1 n_02 [16];
  appender out_00;
  reserve_iterator<fmt::v8::appender> it_00;
  appender out_01;
  reserve_iterator<fmt::v8::appender> it_01;
  appender out_02;
  reserve_iterator<fmt::v8::appender> it_02;
  appender out_03;
  undefined1 value [16];
  type tVar1;
  basic_format_specs<char> *specs_00;
  appender *paVar2;
  char *in_RDX;
  int *in_RSI;
  buffer<char> *in_RDI;
  bool bVar3;
  appender in_stack_00000008;
  anon_class_32_2_ddb8d65b_for_write_digits *in_stack_00000010;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_00000018;
  appender *in_stack_00000020;
  int num_digits_3;
  int num_digits_2;
  bool upper_1;
  int num_digits_1;
  bool upper;
  int num_digits;
  uint prefix;
  unsigned___int128 abs_value;
  write_int_data<char> data;
  uint p;
  appender it;
  write_int_data<char> data_1;
  uint p_1;
  appender it_1;
  write_int_data<char> data_2;
  uint p_2;
  appender it_2;
  write_int_data<char> data_3;
  uint p_3;
  appender it_3;
  value_type *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa4;
  char in_stack_fffffffffffffaa5;
  undefined1 in_stack_fffffffffffffaa6;
  char in_stack_fffffffffffffaa7;
  undefined7 uVar4;
  char value_00;
  uint prefix_00;
  uint prefix_01;
  basic_format_specs<char> *in_stack_fffffffffffffb00;
  locale_ref in_stack_fffffffffffffb28;
  undefined4 uStack_4b4;
  undefined4 uStack_464;
  undefined4 uStack_414;
  undefined4 uStack_3c4;
  uint local_36c;
  buffer<char> *local_368;
  anon_class_32_2_ddb8d65b_for_write_digits *local_360;
  int *local_358;
  buffer<char> *local_348;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_340;
  buffer<char> *local_338;
  anon_class_32_2_ddb8d65b_for_write_digits *local_330;
  undefined8 local_328;
  uint local_318;
  undefined8 local_310;
  undefined8 local_308;
  buffer<char> *local_2f8;
  anon_class_32_2_ddb8d65b_for_write_digits *local_2f0;
  undefined4 local_2e8;
  buffer<char> *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  buffer<char> *local_2b8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_2b0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_2a8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_2a0;
  undefined1 local_295;
  uint local_294;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_290;
  int *local_288;
  uint local_280;
  int local_27c;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_278;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_270;
  buffer<char> *local_268;
  anon_class_32_2_ddb8d65b_for_write_digits *local_260;
  undefined8 local_258;
  uint local_248;
  undefined8 local_240;
  undefined8 local_238;
  buffer<char> *local_228;
  anon_class_32_2_ddb8d65b_for_write_digits *local_220;
  undefined4 local_218;
  undefined1 local_214;
  buffer<char> *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  buffer<char> *local_1e8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1e0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1d8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1d0;
  undefined1 local_1c5;
  uint local_1c4;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1c0;
  int *local_1b8;
  uint local_1b0;
  int local_1ac;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1a8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1a0;
  buffer<char> *local_198;
  anon_class_32_2_ddb8d65b_for_write_digits *local_190;
  undefined8 local_188;
  uint local_178;
  undefined8 local_170;
  undefined8 local_168;
  buffer<char> *local_158;
  anon_class_32_2_ddb8d65b_for_write_digits *local_150;
  undefined4 local_148;
  buffer<char> *local_130;
  undefined8 local_128;
  undefined8 local_120;
  buffer<char> *local_118;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_110;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_108;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_100;
  undefined1 local_f5;
  uint local_f4;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_f0;
  int *local_e8;
  uint local_e0;
  int local_dc;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_d8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_d0;
  buffer<char> *local_c8;
  anon_class_32_2_ddb8d65b_for_write_digits *local_c0;
  undefined8 local_b8;
  uint local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  buffer<char> *local_88;
  anon_class_32_2_ddb8d65b_for_write_digits *local_80;
  undefined4 local_78;
  buffer<char> *local_68;
  undefined8 local_60;
  undefined8 local_58;
  buffer<char> *local_50;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_48;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_40;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_38;
  undefined1 local_2d;
  uint local_2c;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_28;
  int *local_20;
  uint local_18;
  int local_14;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_10;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_8;
  
  prefix_00 = (uint)in_stack_00000008.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                    container;
  prefix_01 = in_stack_00000008.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
              ._4_4_;
  uVar4 = SUB87(in_RDX,0);
  value_00 = (char)((ulong)in_RDX >> 0x38);
  local_368 = (buffer<char> *)
              in_stack_00000008.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
  ;
  local_36c = (uint)in_stack_00000018.container;
  local_360 = in_stack_00000010;
  specs_00 = (basic_format_specs<char> *)(ulong)*(byte *)(in_RSI + 2);
  local_358 = in_RSI;
  local_348 = in_RDI;
  switch(specs_00) {
  case (basic_format_specs<char> *)0x0:
  case (basic_format_specs<char> *)0x1:
    if (((*(ushort *)((long)in_RSI + 9) >> 8 & 1) == 0) ||
       (value._8_4_ = local_36c, value._0_8_ = in_stack_00000010,
       value._12_4_ = (int)((ulong)in_stack_00000018.container >> 0x20),
       bVar3 = write_int_localized<fmt::v8::appender,unsigned__int128,char>
                         (in_stack_00000020,(unsigned___int128)value,prefix_01,
                          in_stack_fffffffffffffb00,in_stack_fffffffffffffb28), !bVar3)) {
      n[4] = in_stack_fffffffffffffaa4;
      n._0_4_ = in_stack_fffffffffffffaa0;
      n[5] = in_stack_fffffffffffffaa5;
      n[6] = in_stack_fffffffffffffaa6;
      n[7] = in_stack_fffffffffffffaa7;
      n._8_8_ = specs_00;
      local_27c = count_digits((uint128_t)n);
      local_338 = local_368;
      local_330 = local_360;
      local_328 = CONCAT44(uStack_3c4,local_27c);
      local_278.container = local_348;
      local_280 = local_36c;
      local_288 = local_358;
      if (*local_358 == 0 && local_358[1] == -1) {
        tVar1 = to_unsigned<int>(0);
        paVar2 = reserve<fmt::v8::appender>
                           ((appender *)&local_278,(ulong)(tVar1 + (local_280 >> 0x18)));
        local_290.container =
             (paVar2->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
        if (local_280 != 0) {
          for (local_294 = local_280 & 0xffffff; local_294 != 0; local_294 = local_294 >> 8) {
            local_295 = (undefined1)local_294;
            local_2a0.container = (buffer<char> *)appender::operator++((appender *)&local_290,0);
            std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_2a0);
            std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=
                      ((back_insert_iterator<fmt::v8::detail::buffer<char>_> *)
                       CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,
                                         CONCAT15(in_stack_fffffffffffffaa5,
                                                  CONCAT14(in_stack_fffffffffffffaa4,
                                                           in_stack_fffffffffffffaa0)))),
                       in_stack_fffffffffffffa98);
          }
        }
        local_2a8.container = local_278.container;
        local_2b8 = local_290.container;
        local_2b0.container =
             (buffer<char> *)
             write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1579:41)>
             ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                       (in_stack_00000010,in_stack_00000018.container);
        local_270.container =
             (buffer<char> *)
             base_iterator<fmt::v8::appender>(local_2a8.container,(appender)local_2b0.container);
      }
      else {
        write_int_data<char>::write_int_data
                  ((write_int_data<char> *)in_stack_00000010,prefix_01,prefix_00,
                   (basic_format_specs<char> *)CONCAT17(value_00,uVar4));
        local_2d0 = local_278.container;
        local_318 = local_280;
        local_310 = local_2c8;
        local_308 = local_2c0;
        local_2f8 = local_338;
        local_2f0 = local_330;
        local_2e8 = (undefined4)local_328;
        out_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ =
             prefix_01;
        out_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ =
             prefix_00;
        local_270.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_>
                       (out_00,(basic_format_specs<char> *)CONCAT17(value_00,uVar4),(size_t)specs_00
                        ,(anon_class_64_3_4ecd7a16 *)
                         CONCAT17(in_stack_fffffffffffffaa7,
                                  CONCAT16(in_stack_fffffffffffffaa6,
                                           CONCAT15(in_stack_fffffffffffffaa5,
                                                    CONCAT14(in_stack_fffffffffffffaa4,
                                                             in_stack_fffffffffffffaa0)))));
      }
      local_340.container = local_270.container;
    }
    else {
      local_340.container = local_348;
    }
    break;
  case (basic_format_specs<char> *)0x2:
    n_02._8_4_ = prefix_00;
    n_02._0_8_ = in_RDX;
    n_02._12_4_ = prefix_01;
    local_14 = count_digits<3,unsigned__int128>((unsigned___int128)n_02);
    if ((((*(ushort *)((long)local_358 + 9) >> 7 & 1) != 0) && (local_358[1] <= local_14)) &&
       (local_368 != (buffer<char> *)0x0 ||
        local_360 != (anon_class_32_2_ddb8d65b_for_write_digits *)0x0)) {
      prefix_append(&local_36c,0x30);
    }
    local_c8 = local_368;
    local_c0 = local_360;
    local_b8 = CONCAT44(uStack_4b4,local_14);
    local_10.container = local_348;
    local_18 = local_36c;
    local_20 = local_358;
    if (*local_358 == 0 && local_358[1] == -1) {
      tVar1 = to_unsigned<int>(0);
      paVar2 = reserve<fmt::v8::appender>((appender *)&local_10,(ulong)(tVar1 + (local_18 >> 0x18)))
      ;
      local_28.container =
           (paVar2->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      if (local_18 != 0) {
        for (local_2c = local_18 & 0xffffff; local_2c != 0; local_2c = local_2c >> 8) {
          local_2d = (undefined1)local_2c;
          local_38.container = (buffer<char> *)appender::operator++((appender *)&local_28,0);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_38);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=
                    ((back_insert_iterator<fmt::v8::detail::buffer<char>_> *)
                     CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,
                                       CONCAT15(in_stack_fffffffffffffaa5,
                                                CONCAT14(in_stack_fffffffffffffaa4,
                                                         in_stack_fffffffffffffaa0)))),
                     in_stack_fffffffffffffa98);
        }
      }
      local_40.container = local_10.container;
      local_50 = local_28.container;
      it_02.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = prefix_01;
      it_02.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ = prefix_00;
      local_48.container =
           (buffer<char> *)
           write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1612:22)>
           ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                     ((anon_class_32_2_ddb8d65b_for_write_digits *)CONCAT17(value_00,uVar4),it_02);
      local_8.container =
           (buffer<char> *)
           base_iterator<fmt::v8::appender>(local_40.container,(appender)local_48.container);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)in_stack_00000010,prefix_01,prefix_00,
                 (basic_format_specs<char> *)CONCAT17(value_00,uVar4));
      local_68 = local_10.container;
      local_a8 = local_18;
      local_a0 = local_60;
      local_98 = local_58;
      local_88 = local_c8;
      local_80 = local_c0;
      local_78 = (undefined4)local_b8;
      out_03.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = prefix_01;
      out_03.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ = prefix_00;
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_>
                     (out_03,(basic_format_specs<char> *)CONCAT17(value_00,uVar4),(size_t)specs_00,
                      (anon_class_64_3_4ecd7a16 *)
                      CONCAT17(in_stack_fffffffffffffaa7,
                               CONCAT16(in_stack_fffffffffffffaa6,
                                        CONCAT15(in_stack_fffffffffffffaa5,
                                                 CONCAT14(in_stack_fffffffffffffaa4,
                                                          in_stack_fffffffffffffaa0)))));
    }
    local_340.container = local_8.container;
    break;
  case (basic_format_specs<char> *)0x3:
  case (basic_format_specs<char> *)0x4:
    bVar3 = (char)in_RSI[2] == '\x04';
    if ((*(ushort *)((long)in_RSI + 9) >> 7 & 1) != 0) {
      in_stack_fffffffffffffaa6 = 0x78;
      in_stack_fffffffffffffaa7 = 'X';
      if (!bVar3) {
        in_stack_fffffffffffffaa7 = 'x';
      }
      prefix_append(&local_36c,(int)in_stack_fffffffffffffaa7 << 8 | 0x30);
    }
    n_00[7] = value_00;
    n_00._0_7_ = uVar4;
    n_00._8_4_ = prefix_00;
    n_00._12_4_ = prefix_01;
    local_1ac = count_digits<4,unsigned__int128>((unsigned___int128)n_00);
    uStack_414 = CONCAT31(uStack_414._1_3_,bVar3);
    local_268 = local_368;
    local_260 = local_360;
    local_258 = CONCAT44(uStack_414,local_1ac);
    local_1a8.container = local_348;
    local_1b0 = local_36c;
    local_1b8 = local_358;
    if (*local_358 == 0 && local_358[1] == -1) {
      tVar1 = to_unsigned<int>(0);
      paVar2 = reserve<fmt::v8::appender>
                         ((appender *)&local_1a8,(ulong)(tVar1 + (local_1b0 >> 0x18)));
      local_1c0.container =
           (paVar2->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      if (local_1b0 != 0) {
        for (local_1c4 = local_1b0 & 0xffffff; local_1c4 != 0; local_1c4 = local_1c4 >> 8) {
          local_1c5 = (undefined1)local_1c4;
          local_1d0.container = (buffer<char> *)appender::operator++((appender *)&local_1c0,0);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_1d0);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=
                    ((back_insert_iterator<fmt::v8::detail::buffer<char>_> *)
                     CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,
                                       CONCAT15(in_stack_fffffffffffffaa5,
                                                CONCAT14(in_stack_fffffffffffffaa4,
                                                         in_stack_fffffffffffffaa0)))),
                     in_stack_fffffffffffffa98);
        }
      }
      local_1d8.container = local_1a8.container;
      local_1e8 = local_1c0.container;
      it_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = prefix_01;
      it_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ = prefix_00;
      local_1e0.container =
           (buffer<char> *)
           write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1590:41)>
           ::anon_class_64_3_4ecd7a16::anon_class_32_3_bd9b568b_for_write_digits::operator()
                     ((anon_class_32_3_bd9b568b_for_write_digits *)CONCAT17(value_00,uVar4),it_00);
      local_1a0.container =
           (buffer<char> *)
           base_iterator<fmt::v8::appender>(local_1d8.container,(appender)local_1e0.container);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)in_stack_00000010,prefix_01,prefix_00,
                 (basic_format_specs<char> *)CONCAT17(value_00,uVar4));
      local_200 = local_1a8.container;
      local_248 = local_1b0;
      local_240 = local_1f8;
      local_238 = local_1f0;
      local_228 = local_268;
      local_220 = local_260;
      local_218 = (undefined4)local_258;
      local_214 = local_258._4_1_;
      out_01.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = prefix_01;
      out_01.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ = prefix_00;
      local_1a0.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_>
                     (out_01,(basic_format_specs<char> *)CONCAT17(value_00,uVar4),(size_t)specs_00,
                      (anon_class_64_3_4ecd7a16 *)
                      CONCAT17(in_stack_fffffffffffffaa7,
                               CONCAT16(in_stack_fffffffffffffaa6,
                                        CONCAT15(in_stack_fffffffffffffaa5,
                                                 CONCAT14(in_stack_fffffffffffffaa4,
                                                          in_stack_fffffffffffffaa0)))));
    }
    local_340.container = local_1a0.container;
    break;
  case (basic_format_specs<char> *)0x5:
  case (basic_format_specs<char> *)0x6:
    if ((*(ushort *)((long)in_RSI + 9) >> 7 & 1) != 0) {
      in_stack_fffffffffffffaa4 = 0x62;
      in_stack_fffffffffffffaa5 = 'B';
      if ((char)in_RSI[2] != '\x06') {
        in_stack_fffffffffffffaa5 = 'b';
      }
      prefix_append(&local_36c,(int)in_stack_fffffffffffffaa5 << 8 | 0x30);
    }
    n_01[7] = value_00;
    n_01._0_7_ = uVar4;
    n_01._8_4_ = prefix_00;
    n_01._12_4_ = prefix_01;
    local_dc = count_digits<1,unsigned__int128>((unsigned___int128)n_01);
    local_198 = local_368;
    local_190 = local_360;
    local_188 = CONCAT44(uStack_464,local_dc);
    local_d8.container = local_348;
    local_e0 = local_36c;
    local_e8 = local_358;
    if (*local_358 == 0 && local_358[1] == -1) {
      tVar1 = to_unsigned<int>(0);
      paVar2 = reserve<fmt::v8::appender>((appender *)&local_d8,(ulong)(tVar1 + (local_e0 >> 0x18)))
      ;
      local_f0.container =
           (paVar2->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      if (local_e0 != 0) {
        for (local_f4 = local_e0 & 0xffffff; local_f4 != 0; local_f4 = local_f4 >> 8) {
          local_f5 = (undefined1)local_f4;
          local_100.container = (buffer<char> *)appender::operator++((appender *)&local_f0,0);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_100);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=
                    ((back_insert_iterator<fmt::v8::detail::buffer<char>_> *)
                     CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,
                                       CONCAT15(in_stack_fffffffffffffaa5,
                                                CONCAT14(in_stack_fffffffffffffaa4,
                                                         in_stack_fffffffffffffaa0)))),
                     in_stack_fffffffffffffa98);
        }
      }
      local_108.container = local_d8.container;
      local_118 = local_f0.container;
      it_01.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = prefix_01;
      it_01.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ = prefix_00;
      local_110.container =
           (buffer<char> *)
           write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1601:22)>
           ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                     ((anon_class_32_2_ddb8d65b_for_write_digits *)CONCAT17(value_00,uVar4),it_01);
      local_d0.container =
           (buffer<char> *)
           base_iterator<fmt::v8::appender>(local_108.container,(appender)local_110.container);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)in_stack_00000010,prefix_01,prefix_00,
                 (basic_format_specs<char> *)CONCAT17(value_00,uVar4));
      local_130 = local_d8.container;
      local_178 = local_e0;
      local_170 = local_128;
      local_168 = local_120;
      local_158 = local_198;
      local_150 = local_190;
      local_148 = (undefined4)local_188;
      out_02.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = prefix_01;
      out_02.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ = prefix_00;
      local_d0.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_>
                     (out_02,(basic_format_specs<char> *)CONCAT17(value_00,uVar4),(size_t)specs_00,
                      (anon_class_64_3_4ecd7a16 *)
                      CONCAT17(in_stack_fffffffffffffaa7,
                               CONCAT16(in_stack_fffffffffffffaa6,
                                        CONCAT15(in_stack_fffffffffffffaa5,
                                                 CONCAT14(in_stack_fffffffffffffaa4,
                                                          in_stack_fffffffffffffaa0)))));
    }
    local_340.container = local_d0.container;
    break;
  default:
    throw_format_error(in_RDX);
  case (basic_format_specs<char> *)0xf:
    local_340.container =
         (buffer<char> *)write_char<char,fmt::v8::appender>(in_stack_00000008,value_00,specs_00);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_340.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}